

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::flip41(tetgenmesh *this,triface *fliptets,int hullflag,flipconstraints *fc)

{
  int iVar1;
  tetrahedron p2;
  tetrahedron p3;
  tetrahedron p3_00;
  tetrahedron p1;
  point pt;
  face *local_180;
  triface *local_160;
  undefined1 local_158 [8];
  face checksh;
  face checkseg;
  double vol_diff;
  double volpos [1];
  double volneg [4];
  int i;
  int t1ver;
  int scount;
  int spivot;
  int dummyflag;
  point pp;
  point pd;
  point pc;
  point pb;
  point pa;
  face flipshs [4];
  triface neightet;
  triface newface;
  triface botcastet;
  triface topcastets [3];
  flipconstraints *fc_local;
  int hullflag_local;
  triface *fliptets_local;
  tetgenmesh *this_local;
  
  local_160 = (triface *)&botcastet.ver;
  topcastets[2]._8_8_ = fc;
  do {
    triface::triface(local_160);
    local_160 = local_160 + 1;
  } while (local_160 != (triface *)&topcastets[2].ver);
  triface::triface((triface *)&newface.ver);
  triface::triface((triface *)&neightet.ver);
  triface::triface((triface *)&flipshs[3].shver);
  local_180 = (face *)&pa;
  do {
    face::face(local_180);
    local_180 = local_180 + 1;
  } while (local_180 != (face *)&flipshs[3].shver);
  scount = 0;
  t1ver = -1;
  i = 0;
  p2 = (tetrahedron)org(this,fliptets + 3);
  p3 = (tetrahedron)dest(this,fliptets + 3);
  p3_00 = (tetrahedron)apex(this,fliptets + 3);
  p1 = (tetrahedron)dest(this,fliptets);
  pt = org(this,fliptets);
  this->flip41count = this->flip41count + 1;
  for (volneg[3]._4_4_ = 0; volneg[3]._4_4_ < 3; volneg[3]._4_4_ = volneg[3]._4_4_ + 1) {
    enext(this,fliptets + volneg[3]._4_4_,(triface *)&topcastets[(long)volneg[3]._4_4_ + -1].ver);
    iVar1 = *(int *)&topcastets[volneg[3]._4_4_].tet;
    decode(this,*(tetrahedron *)
                 (*(long *)&topcastets[(long)volneg[3]._4_4_ + -1].ver +
                 (long)facepivot1[*(int *)&topcastets[volneg[3]._4_4_].tet] * 8),
           (triface *)&topcastets[(long)volneg[3]._4_4_ + -1].ver);
    *(int *)&topcastets[volneg[3]._4_4_].tet =
         facepivot2[iVar1][*(int *)&topcastets[volneg[3]._4_4_].tet];
    enextself(this,(triface *)&topcastets[(long)volneg[3]._4_4_ + -1].ver);
  }
  fsym(this,fliptets + 3,(triface *)&newface.ver);
  if (this->checksubfaceflag != 0) {
    for (volneg[3]._4_4_ = 0; volneg[3]._4_4_ < 3; volneg[3]._4_4_ = volneg[3]._4_4_ + 1) {
      fnext(this,fliptets + 3,(triface *)&neightet.ver);
      tspivot(this,(triface *)&neightet.ver,(face *)&flipshs[(long)volneg[3]._4_4_ + -1].shver);
      if (*(long *)&flipshs[(long)volneg[3]._4_4_ + -1].shver != 0) {
        t1ver = volneg[3]._4_4_;
        i = i + 1;
      }
      enextself(this,fliptets + 3);
    }
    if (0 < i) {
      if (i < 3) {
        fsym(this,(triface *)&topcastets[(long)t1ver + -1].ver,(triface *)&flipshs[3].shver);
        for (volneg[3]._4_4_ = 0; volneg[3]._4_4_ < 3; volneg[3]._4_4_ = volneg[3]._4_4_ + 1) {
          esym(this,(triface *)&flipshs[3].shver,(triface *)&neightet.ver);
          tspivot(this,(triface *)&neightet.ver,(face *)&flipshs[(long)volneg[3]._4_4_ + -1].shver);
          eprevself(this,(triface *)&flipshs[3].shver);
        }
      }
      else {
        t1ver = 3;
      }
    }
  }
  fliptets->ver = 0xb;
  setelemmarker(this,fliptets->tet,0);
  if ((this->checksubsegflag != 0) && (fliptets->tet[8] != (tetrahedron)0x0)) {
    memorypool::dealloc(this->tet2segpool,fliptets->tet[8]);
    fliptets->tet[8] = (tetrahedron)0x0;
  }
  if ((this->checksubfaceflag != 0) && (fliptets->tet[9] != (tetrahedron)0x0)) {
    memorypool::dealloc(this->tet2subpool,fliptets->tet[9]);
    fliptets->tet[9] = (tetrahedron)0x0;
  }
  for (volneg[3]._4_4_ = 1; volneg[3]._4_4_ < 4; volneg[3]._4_4_ = volneg[3]._4_4_ + 1) {
    tetrahedrondealloc(this,fliptets[volneg[3]._4_4_].tet);
  }
  if (pt != this->dummypoint) {
    setpointtype(this,pt,UNUSEDVERTEX);
    this->unuverts = this->unuverts + 1;
  }
  if (hullflag < 1) {
    fliptets->tet[orgpivot[fliptets->ver]] = p2;
    fliptets->tet[destpivot[fliptets->ver]] = p3;
    fliptets->tet[apexpivot[fliptets->ver]] = p3_00;
    fliptets->tet[oppopivot[fliptets->ver]] = p1;
  }
  else {
    if (p2 == (tetrahedron)this->dummypoint) {
      fliptets->tet[orgpivot[fliptets->ver]] = p3_00;
      fliptets->tet[destpivot[fliptets->ver]] = p3;
      fliptets->tet[apexpivot[fliptets->ver]] = p1;
      fliptets->tet[oppopivot[fliptets->ver]] = p2;
      esymself(this,fliptets);
      eprevself(this,fliptets);
      scount = 1;
    }
    else if (p3 == (tetrahedron)this->dummypoint) {
      fliptets->tet[orgpivot[fliptets->ver]] = p2;
      fliptets->tet[destpivot[fliptets->ver]] = p3_00;
      fliptets->tet[apexpivot[fliptets->ver]] = p1;
      fliptets->tet[oppopivot[fliptets->ver]] = p3;
      esymself(this,fliptets);
      enextself(this,fliptets);
      scount = 2;
    }
    else if (p3_00 == (tetrahedron)this->dummypoint) {
      fliptets->tet[orgpivot[fliptets->ver]] = p3;
      fliptets->tet[destpivot[fliptets->ver]] = p2;
      fliptets->tet[apexpivot[fliptets->ver]] = p1;
      fliptets->tet[oppopivot[fliptets->ver]] = p3_00;
      esymself(this,fliptets);
      scount = 3;
    }
    else if (p1 == (tetrahedron)this->dummypoint) {
      fliptets->tet[orgpivot[fliptets->ver]] = p2;
      fliptets->tet[destpivot[fliptets->ver]] = p3;
      fliptets->tet[apexpivot[fliptets->ver]] = p3_00;
      fliptets->tet[oppopivot[fliptets->ver]] = p1;
      scount = 4;
    }
    else {
      fliptets->tet[orgpivot[fliptets->ver]] = p2;
      fliptets->tet[destpivot[fliptets->ver]] = p3;
      fliptets->tet[apexpivot[fliptets->ver]] = p3_00;
      fliptets->tet[oppopivot[fliptets->ver]] = p1;
      if (pt == this->dummypoint) {
        scount = -1;
      }
      else {
        scount = 0;
      }
    }
    if (scount < 1) {
      if (scount < 0) {
        this->hullsize = this->hullsize + -4;
      }
    }
    else {
      this->hullsize = this->hullsize + -2;
    }
  }
  if (*(int *)(topcastets[2]._8_8_ + 0x14) != 0) {
    if (scount < 1) {
      if (scount < 0) {
        volpos[0] = 0.0;
        volneg[0] = 0.0;
        volneg[1] = 0.0;
        volneg[2] = 0.0;
        vol_diff = tetprismvol(this,(double *)p2,(double *)p3,(double *)p3_00,(double *)p1);
      }
      else {
        volpos[0] = tetprismvol(this,pt,(double *)p1,(double *)p2,(double *)p3);
        volneg[0] = tetprismvol(this,pt,(double *)p1,(double *)p3,(double *)p3_00);
        volneg[1] = tetprismvol(this,pt,(double *)p1,(double *)p3_00,(double *)p2);
        volneg[2] = tetprismvol(this,(double *)p2,(double *)p3,(double *)p3_00,pt);
        vol_diff = tetprismvol(this,(double *)p2,(double *)p3,(double *)p3_00,(double *)p1);
      }
    }
    else {
      if (p2 == (tetrahedron)this->dummypoint) {
        volpos[0] = 0.0;
        volneg[0] = tetprismvol(this,pt,(double *)p1,(double *)p3,(double *)p3_00);
        volneg[1] = 0.0;
        volneg[2] = 0.0;
      }
      else {
        if (p3 == (tetrahedron)this->dummypoint) {
          volpos[0] = 0.0;
          volneg[1] = tetprismvol(this,pt,(double *)p1,(double *)p3_00,(double *)p2);
          volneg[2] = 0.0;
        }
        else {
          if (p3_00 == (tetrahedron)this->dummypoint) {
            volpos[0] = tetprismvol(this,pt,(double *)p1,(double *)p2,(double *)p3);
            volneg[2] = 0.0;
          }
          else {
            volpos[0] = 0.0;
            volneg[2] = tetprismvol(this,(double *)p2,(double *)p3,(double *)p3_00,pt);
          }
          volneg[1] = 0.0;
        }
        volneg[0] = 0.0;
      }
      vol_diff = 0.0;
    }
    *(double *)(topcastets[2]._8_8_ + 0x20) =
         ((((vol_diff - volpos[0]) - volneg[0]) - volneg[1]) - volneg[2]) +
         *(double *)(topcastets[2]._8_8_ + 0x20);
  }
  for (volneg[3]._4_4_ = 0; volneg[3]._4_4_ < 3; volneg[3]._4_4_ = volneg[3]._4_4_ + 1) {
    esym(this,fliptets,(triface *)&neightet.ver);
    bond(this,(triface *)&neightet.ver,(triface *)&topcastets[(long)volneg[3]._4_4_ + -1].ver);
    enextself(this,fliptets);
  }
  bond(this,fliptets,(triface *)&newface.ver);
  if (this->checksubsegflag != 0) {
    face::face((face *)&checksh.shver);
    for (volneg[3]._4_4_ = 0; volneg[3]._4_4_ < 3; volneg[3]._4_4_ = volneg[3]._4_4_ + 1) {
      eprev(this,(triface *)&topcastets[(long)volneg[3]._4_4_ + -1].ver,(triface *)&neightet.ver);
      if ((*(long *)(neightet._8_8_ + 0x40) != 0) &&
         (*(long *)(*(long *)(neightet._8_8_ + 0x40) + (long)ver2edge[(int)newface.tet] * 8) != 0))
      {
        tsspivot1(this,(triface *)&neightet.ver,(face *)&checksh.shver);
        esym(this,fliptets,(triface *)&neightet.ver);
        enextself(this,(triface *)&neightet.ver);
        tssbond1(this,(triface *)&neightet.ver,(face *)&checksh.shver);
        sstbond1(this,(face *)&checksh.shver,(triface *)&neightet.ver);
        if ((*(uint *)(topcastets[2]._8_8_ + 4) & 1) != 0) {
          enqueuesubface(this,this->badsubsegs,(face *)&checksh.shver);
        }
      }
      enextself(this,fliptets);
    }
    for (volneg[3]._4_4_ = 0; volneg[3]._4_4_ < 3; volneg[3]._4_4_ = volneg[3]._4_4_ + 1) {
      if ((*(long *)(*(long *)&topcastets[(long)volneg[3]._4_4_ + -1].ver + 0x40) != 0) &&
         (*(long *)(*(long *)(*(long *)&topcastets[(long)volneg[3]._4_4_ + -1].ver + 0x40) +
                   (long)ver2edge[*(int *)&topcastets[volneg[3]._4_4_].tet] * 8) != 0)) {
        tsspivot1(this,(triface *)&topcastets[(long)volneg[3]._4_4_ + -1].ver,(face *)&checksh.shver
                 );
        tssbond1(this,fliptets,(face *)&checksh.shver);
        sstbond1(this,(face *)&checksh.shver,fliptets);
        if ((*(uint *)(topcastets[2]._8_8_ + 4) & 1) != 0) {
          enqueuesubface(this,this->badsubsegs,(face *)&checksh.shver);
        }
      }
      enextself(this,fliptets);
    }
  }
  if (this->checksubfaceflag != 0) {
    face::face((face *)local_158);
    for (volneg[3]._4_4_ = 0; volneg[3]._4_4_ < 3; volneg[3]._4_4_ = volneg[3]._4_4_ + 1) {
      if ((*(long *)(*(long *)&topcastets[(long)volneg[3]._4_4_ + -1].ver + 0x48) != 0) &&
         (*(long *)(*(long *)(*(long *)&topcastets[(long)volneg[3]._4_4_ + -1].ver + 0x48) +
                   (long)(int)(*(uint *)&topcastets[volneg[3]._4_4_].tet & 3) * 8) != 0)) {
        tspivot(this,(triface *)&topcastets[(long)volneg[3]._4_4_ + -1].ver,(face *)local_158);
        esym(this,fliptets,(triface *)&neightet.ver);
        sesymself(this,(face *)local_158);
        tsbond(this,(triface *)&neightet.ver,(face *)local_158);
        if ((*(uint *)(topcastets[2]._8_8_ + 4) & 2) != 0) {
          enqueuesubface(this,this->badsubfacs,(face *)local_158);
        }
      }
      enextself(this,fliptets);
    }
    if ((*(long *)(newface._8_8_ + 0x48) != 0) &&
       (*(long *)(*(long *)(newface._8_8_ + 0x48) + (long)(int)((uint)botcastet.tet & 3) * 8) != 0))
    {
      tspivot(this,(triface *)&newface.ver,(face *)local_158);
      sesymself(this,(face *)local_158);
      tsbond(this,fliptets,(face *)local_158);
      if ((*(uint *)(topcastets[2]._8_8_ + 4) & 2) != 0) {
        enqueuesubface(this,this->badsubfacs,(face *)local_158);
      }
    }
    if (-1 < t1ver) {
      for (volneg[3]._4_4_ = 0; volneg[3]._4_4_ < 3; volneg[3]._4_4_ = volneg[3]._4_4_ + 1) {
        senext2self(this,(face *)&flipshs[(long)volneg[3]._4_4_ + -1].shver);
      }
      flip31(this,(face *)&pa,0);
      for (volneg[3]._4_4_ = 0; volneg[3]._4_4_ < 3; volneg[3]._4_4_ = volneg[3]._4_4_ + 1) {
        shellfacedealloc(this,this->subfaces,
                         *(shellface **)&flipshs[(long)volneg[3]._4_4_ + -1].shver);
      }
      if (t1ver < 3) {
        tsbond(this,(triface *)&topcastets[(long)t1ver + -1].ver,(face *)&flipshs[2].shver);
        fsym(this,(triface *)&topcastets[(long)t1ver + -1].ver,(triface *)&neightet.ver);
        sesym(this,(face *)&flipshs[2].shver,(face *)local_158);
        tsbond(this,(triface *)&neightet.ver,(face *)local_158);
      }
      else {
        tsbond(this,fliptets,(face *)&flipshs[2].shver);
        fsym(this,fliptets,(triface *)&neightet.ver);
        sesym(this,(face *)&flipshs[2].shver,(face *)local_158);
        tsbond(this,(triface *)&neightet.ver,(face *)local_158);
      }
    }
  }
  if ((*(uint *)(topcastets[2]._8_8_ + 4) & 4) != 0) {
    enqueuetetrahedron(this,fliptets);
  }
  setpoint2tet(this,(point)p2,(tetrahedron)fliptets->tet);
  setpoint2tet(this,(point)p3,(tetrahedron)fliptets->tet);
  setpoint2tet(this,(point)p3_00,(tetrahedron)fliptets->tet);
  setpoint2tet(this,(point)p1,(tetrahedron)fliptets->tet);
  if ((0 < *(int *)topcastets[2]._8_8_) &&
     (flippush(this,&this->flipstack,fliptets), 1 < *(int *)topcastets[2]._8_8_)) {
    for (volneg[3]._4_4_ = 0; volneg[3]._4_4_ < 3; volneg[3]._4_4_ = volneg[3]._4_4_ + 1) {
      esym(this,fliptets,(triface *)&neightet.ver);
      flippush(this,&this->flipstack,(triface *)&neightet.ver);
      enextself(this,fliptets);
    }
  }
  triface::operator=(&this->recenttet,fliptets);
  return;
}

Assistant:

void tetgenmesh::flip41(triface* fliptets, int hullflag, flipconstraints *fc)
{
  triface topcastets[3], botcastet;
  triface newface, neightet;
  face flipshs[4];
  point pa, pb, pc, pd, pp;
  int dummyflag = 0; // in {0, 1, 2, 3, 4}
  int spivot = -1, scount = 0;
  int t1ver; 
  int i;

  pa =  org(fliptets[3]);
  pb = dest(fliptets[3]);
  pc = apex(fliptets[3]);
  pd = dest(fliptets[0]);
  pp =  org(fliptets[0]); // The removing vertex.

  flip41count++;

  // Get the outer boundary faces.
  for (i = 0; i < 3; i++) {
    enext(fliptets[i], topcastets[i]);
    fnextself(topcastets[i]); // [d,a,b,#], [d,b,c,#], [d,c,a,#]
    enextself(topcastets[i]); // [a,b,d,#], [b,c,d,#], [c,a,d,#]
  }
  fsym(fliptets[3], botcastet); // [b,a,c,#]

  if (checksubfaceflag) {
    // Check if there are three subfaces at 'p'.
    //   Re-use 'newface'.
    for (i = 0; i < 3; i++) {
      fnext(fliptets[3], newface); // [a,b,p,d],[b,c,p,d],[c,a,p,d].
      tspivot(newface, flipshs[i]);
      if (flipshs[i].sh != NULL) {
        spivot = i; // Remember this subface.
        scount++;
      }
      enextself(fliptets[3]);
    }
    if (scount > 0) {
      // There are three subfaces connecting at p.
      if (scount < 3) {
        // The new subface is one of {[a,b,d], [b,c,d], [c,a,d]}.
        // Go to the tet containing the three subfaces.
        fsym(topcastets[spivot], neightet);
        // Get the three subfaces connecting at p.
        for (i = 0; i < 3; i++) {
          esym(neightet, newface);
          tspivot(newface, flipshs[i]);
          eprevself(neightet);
        }
      } else {
        spivot = 3; // The new subface is [a,b,c].
      }
    }
  } // if (checksubfaceflag)


  // Re-use fliptets[0] for [a,b,c,d].
  fliptets[0].ver = 11;
  setelemmarker(fliptets[0].tet, 0); // Clean all flags.
  // NOTE: the element attributes and volume constraint remain unchanged.
  if (checksubsegflag) {
    // Dealloc the space to subsegments.
    if (fliptets[0].tet[8] != NULL) {
      tet2segpool->dealloc((shellface *) fliptets[0].tet[8]);
      fliptets[0].tet[8] = NULL;
    }
  }
  if (checksubfaceflag) {
    // Dealloc the space to subfaces.
    if (fliptets[0].tet[9] != NULL) {
      tet2subpool->dealloc((shellface *) fliptets[0].tet[9]);
      fliptets[0].tet[9] = NULL;
    }
  }
  // Delete the other three tets.
  for (i = 1; i < 4; i++) {
    tetrahedrondealloc(fliptets[i].tet);
  }

  if (pp != dummypoint) {
    // Mark the point pp as unused.
    setpointtype(pp, UNUSEDVERTEX);
    unuverts++;
  }

  // Create the new tet [a,b,c,d].
  if (hullflag > 0) {
    // One of the five vertices may be 'dummypoint'.
    if (pa == dummypoint) {
      // pa is dummypoint.
      setvertices(fliptets[0], pc, pb, pd, pa);
      esymself(fliptets[0]);  // [b,c,a,d]
      eprevself(fliptets[0]); // [a,b,c,d]
      dummyflag = 1;
    } else if (pb == dummypoint) {
      setvertices(fliptets[0], pa, pc, pd, pb);
      esymself(fliptets[0]);  // [c,a,b,d]
      enextself(fliptets[0]); // [a,b,c,d]
      dummyflag = 2;
    } else if (pc == dummypoint) {
      setvertices(fliptets[0], pb, pa, pd, pc);
      esymself(fliptets[0]);  // [a,b,c,d]
      dummyflag = 3;
    } else if (pd == dummypoint) {
      setvertices(fliptets[0], pa, pb, pc, pd);
      dummyflag = 4;
    } else {
      setvertices(fliptets[0], pa, pb, pc, pd);
      if (pp == dummypoint) {
        dummyflag = -1;
      } else {
        dummyflag = 0;
      }
    }
    if (dummyflag > 0) {
      // We deleted 3 hull tets, and create 1 hull tet.
      hullsize -= 2;
    } else if (dummyflag < 0) {
      // We deleted 4 hull tets.
      hullsize -= 4;
      // meshedges does not change.
    }
  } else {
    setvertices(fliptets[0], pa, pb, pc, pd);
  }

  if (fc->remove_ndelaunay_edge) { // calc_tetprism_vol
    REAL volneg[4], volpos[1], vol_diff;
    if (dummyflag > 0) {
      if (pa == dummypoint) {
        volneg[0] = 0.;
        volneg[1] = tetprismvol(pp, pd, pb, pc);
        volneg[2] = 0.;
        volneg[3] = 0.;
      } else if (pb == dummypoint) {
        volneg[0] = 0.;
        volneg[1] = 0.;
        volneg[2] = tetprismvol(pp, pd, pc, pa);
        volneg[3] = 0.;
      } else if (pc == dummypoint) {
        volneg[0] = tetprismvol(pp, pd, pa, pb);
        volneg[1] = 0.;
        volneg[2] = 0.;
        volneg[3] = 0.;
      } else { // pd == dummypoint
        volneg[0] = 0.;
        volneg[1] = 0.;
        volneg[2] = 0.;
        volneg[3] = tetprismvol(pa, pb, pc, pp);
      }
      volpos[0] = 0.;
    } else if (dummyflag < 0) {
      volneg[0] = 0.;
      volneg[1] = 0.;
      volneg[2] = 0.;
      volneg[3] = 0.;
      volpos[0] = tetprismvol(pa, pb, pc, pd);
    } else {
      volneg[0] = tetprismvol(pp, pd, pa, pb);
      volneg[1] = tetprismvol(pp, pd, pb, pc);
      volneg[2] = tetprismvol(pp, pd, pc, pa);
      volneg[3] = tetprismvol(pa, pb, pc, pp);
      volpos[0] = tetprismvol(pa, pb, pc, pd);
    }
    vol_diff = volpos[0] - volneg[0] - volneg[1] - volneg[2] - volneg[3];
    fc->tetprism_vol_sum  += vol_diff; // Update the total sum.
  }

  // Bond the new tet to adjacent tets.
  for (i = 0; i < 3; i++) {
    esym(fliptets[0], newface); // At faces [b,a,d], [c,b,d], [a,c,d].
    bond(newface, topcastets[i]);
    enextself(fliptets[0]);
  }
  bond(fliptets[0], botcastet);

  if (checksubsegflag) {
    face checkseg;
    // Bond 6 segments (at edges of [a,b,c,d]) if there there are.
    for (i = 0; i < 3; i++) {
      eprev(topcastets[i], newface); // At edges [d,a],[d,b],[d,c].
      if (issubseg(newface)) {
        tsspivot1(newface, checkseg);
        esym(fliptets[0], newface);
        enextself(newface); // At edges [a,d], [b,d], [c,d].
        tssbond1(newface, checkseg);
        sstbond1(checkseg, newface);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      enextself(fliptets[0]);
    }
    for (i = 0; i < 3; i++) {
      if (issubseg(topcastets[i])) {
        tsspivot1(topcastets[i], checkseg); // At edges [a,b],[b,c],[c,a].
        tssbond1(fliptets[0], checkseg);
        sstbond1(checkseg, fliptets[0]);
        if (fc->chkencflag & 1) {
          enqueuesubface(badsubsegs, &checkseg);
        }
      }
      enextself(fliptets[0]);
    }
  }

  if (checksubfaceflag) {
    face checksh;
    // Bond 4 subfaces (at faces of [a,b,c,d]) if there are.
    for (i = 0; i < 3; i++) {
      if (issubface(topcastets[i])) {
        tspivot(topcastets[i], checksh); // At faces [a,b,d],[b,c,d],[c,a,d]
        esym(fliptets[0], newface); // At faces [b,a,d],[c,b,d],[a,c,d]
        sesymself(checksh);
        tsbond(newface, checksh);
        if (fc->chkencflag & 2) {
          enqueuesubface(badsubfacs, &checksh);
        }
      }
      enextself(fliptets[0]);
    }
    if (issubface(botcastet)) {
      tspivot(botcastet, checksh); // At face [b,a,c]
      sesymself(checksh);
      tsbond(fliptets[0], checksh);
      if (fc->chkencflag & 2) {
        enqueuesubface(badsubfacs, &checksh);
      }
    }

    if (spivot >= 0) {
      // Perform a 3-to-1 flip in surface triangulation.
      // Depending on the value of 'spivot', the three subfaces are:
      //   - 0: [a,b,p], [b,d,p], [d,a,p]
      //   - 1: [b,c,p], [c,d,p], [d,b,p] 
      //   - 2: [c,a,p], [a,d,p], [d,c,p] 
      //   - 3: [a,b,p], [b,c,p], [c,a,p]
      // Adjust the three subfaces such that their origins are p, i.e., 
      //   - 3: [p,a,b], [p,b,c], [p,c,a]. (Required by the flip31()).
      for (i = 0; i < 3; i++) {
        senext2self(flipshs[i]);
      }
      flip31(flipshs, 0);
      // Delete the three old subfaces.
      for (i = 0; i < 3; i++) {
        shellfacedealloc(subfaces, flipshs[i].sh);
      }
      if (spivot < 3) {
        // // Bond the new subface to the new tet [a,b,c,d].
        tsbond(topcastets[spivot], flipshs[3]);
        fsym(topcastets[spivot], newface);
        sesym(flipshs[3], checksh);
        tsbond(newface, checksh);
      } else {
        // Bound the new subface [a,b,c] to the new tet [a,b,c,d].
        tsbond(fliptets[0], flipshs[3]);
        fsym(fliptets[0], newface);
        sesym(flipshs[3], checksh);
        tsbond(newface, checksh);
      }
    } // if (spivot > 0)
  } // if (checksubfaceflag)

  if (fc->chkencflag & 4) {
    enqueuetetrahedron(&(fliptets[0]));
  }

  // Update the point-to-tet map.
  setpoint2tet(pa, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pb, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pc, (tetrahedron) fliptets[0].tet);
  setpoint2tet(pd, (tetrahedron) fliptets[0].tet);

  if (fc->enqflag > 0) {
    // Queue faces which may be locally non-Delaunay.
    flippush(flipstack, &(fliptets[0])); // [a,b,c] (opposite to new point).
    if (fc->enqflag > 1) {
      for (i = 0; i < 3; i++) {
        esym(fliptets[0], newface);
        flippush(flipstack, &newface);
        enextself(fliptets[0]);
      }
    }
  }

  recenttet = fliptets[0];
}